

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::nameinfo::getdata(nameinfo *this,uint8_t *p,ImgfsFile *imgfs)

{
  uint uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  size_t len;
  ulong uVar4;
  undefined8 *puVar5;
  iterator __first;
  iterator __last;
  size_type sVar6;
  element_type *peVar7;
  unsigned_short *puVar8;
  string local_118;
  undefined1 local_f8 [32];
  ulong local_d8;
  size_t rounded;
  NameEntry ent;
  Wstring wstr_1;
  unsigned_short local_4a;
  undefined1 local_48 [8];
  Wstring wstr;
  int newtype;
  int oldtype;
  ImgfsFile *imgfs_local;
  uint8_t *p_local;
  nameinfo *this_local;
  
  wstr.field_2._12_4_ = nametype((ulong)this->_length);
  len = std::__cxx11::string::size();
  wstr.field_2._8_4_ = nametype(len);
  if (wstr.field_2._12_4_ != wstr.field_2._8_4_) {
    if (wstr.field_2._12_4_ == 1) {
      freeent(imgfs,(ulong)this->_ptr);
    }
    else if (wstr.field_2._12_4_ == 2) {
      uVar1 = this->_ptr;
      uVar3 = roundtochunk(imgfs,(uint)this->_length << 1);
      freechunk(imgfs,(ulong)uVar1,uVar3);
    }
    this->_ptr = 0;
  }
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < 0x10000) {
    uVar2 = std::__cxx11::string::size();
    this->_length = uVar2;
    set16le<unsigned_char*>(p,this->_length);
    if (wstr.field_2._8_4_ == 0) {
      set16le<unsigned_char*>(p + 2,this->_flags);
      ToWString<char>((Wstring *)local_48,&this->_name);
      local_4a = 0;
      std::fill_n<unsigned_short*,int,unsigned_short>((unsigned_short *)(p + 4),4,&local_4a);
      __first = std::__cxx11::
                basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                ::begin((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                         *)local_48);
      __last = std::__cxx11::
               basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
               ::end((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                      *)local_48);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_short*,std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>,unsigned_short*>
                ((__normal_iterator<unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
                  )__last._M_current,(unsigned_short *)(p + 4));
      std::__cxx11::
      basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
      ::~basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                       *)local_48);
    }
    else {
      if (this->_ptr == 0) {
        ToWString<char>((Wstring *)((long)&ent._name.field_2 + 8),&this->_name);
        if (wstr.field_2._8_4_ == 1) {
          *(byte *)&this->_flags = (byte)this->_flags | 2;
          NameEntry::NameEntry((NameEntry *)&rounded,&this->_name);
          DirEntry::save((DirEntry *)&rounded,imgfs);
          uVar3 = DirEntry::offset((DirEntry *)&rounded);
          this->_ptr = uVar3;
          NameEntry::~NameEntry((NameEntry *)&rounded);
        }
        else {
          sVar6 = std::__cxx11::
                  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                  ::size((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                          *)((long)&ent._name.field_2 + 8));
          uVar3 = roundtochunk(imgfs,(int)sVar6 * 2);
          local_d8 = (ulong)uVar3;
          uVar3 = allocchunk(imgfs,uVar3,NAMECHUNK);
          this->_ptr = uVar3;
          std::__cxx11::
          basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
          ::resize((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                    *)((long)&ent._name.field_2 + 8),local_d8 >> 1);
          ImgfsFile::rd((ImgfsFile *)(local_f8 + 0x10));
          peVar7 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(local_f8 + 0x10));
          (*peVar7->_vptr_ReadWriter[4])(peVar7,(ulong)this->_ptr);
          std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)(local_f8 + 0x10));
          ImgfsFile::rd((ImgfsFile *)local_f8);
          peVar7 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_f8);
          puVar8 = std::__cxx11::
                   basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                   ::c_str((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                            *)((long)&ent._name.field_2 + 8));
          (*peVar7->_vptr_ReadWriter[3])(peVar7,puVar8,local_d8);
          std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_f8);
        }
        std::__cxx11::
        basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
        ::~basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                         *)((long)&ent._name.field_2 + 8));
      }
      std::__cxx11::string::string((string *)&local_118,(string *)&this->_name);
      uVar3 = calc_name_hash(&local_118);
      this->_hash = uVar3;
      std::__cxx11::string::~string((string *)&local_118);
      set16le<unsigned_char*>(p + 2,this->_flags);
      set32le<unsigned_char*>(p + 4,this->_hash);
      set32le<unsigned_char*>(p + 8,this->_ptr);
    }
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "filename too long";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void getdata(uint8_t *p, ImgfsFile& imgfs)
        {
            int oldtype= nametype(_length);
            int newtype= nametype(_name.size());

            // first free resources
            if (oldtype!=newtype) {
                if (oldtype==IN_NAME_ENTRY)
                    imgfs.freeent(_ptr);
                else if (oldtype==IN_NAME_CHUNK)
                    imgfs.freechunk(_ptr, imgfs.roundtochunk(_length*sizeof(WCHAR)));
                _ptr= 0;
            }
            if (_name.size()>=0x10000)
                throw "filename too long";
            _length= (uint16_t)_name.size();
            set16le(p, _length);
            if (newtype==IN_DIR_ENTRY) {
                set16le(p+2, _flags);
                std::Wstring wstr= ToWString(_name);
                std::fill_n((WCHAR*)(p+4), 4, WCHAR(0));
                // note: nonportable endian cast
                std::copy(wstr.begin(), wstr.end(), (WCHAR*)(p+4));
            }
            else {
                if (_ptr==0) {
                    std::Wstring wstr= ToWString(_name);
                    if (newtype==IN_NAME_ENTRY)
                    {
                        _flags|= 2;
                        NameEntry ent(_name);
                        ent.save(imgfs);
                        _ptr= ent.offset();
                    }
                    else {
                        size_t rounded= imgfs.roundtochunk(wstr.size()*sizeof(WCHAR));
                        // alloc chunk
                        _ptr= imgfs.allocchunk(rounded, NAMECHUNK);

                        wstr.resize(rounded/sizeof(WCHAR));
                        imgfs.rd()->setpos(_ptr);
                        //printf("nameinfo: getdata(%08x)\n", _ptr);
                        imgfs.rd()->write((const uint8_t*)wstr.c_str(), rounded);
                    }
                }
                _hash= calc_name_hash(_name);
                set16le(p+2, _flags);
                set32le(p+4, _hash);
                set32le(p+8, _ptr);
            }
        }